

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_Interval::Union(ON_Interval *this,ON_Interval *ain,ON_Interval *bin)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = EmptyInterval.m_t[1];
  dVar1 = bin->m_t[0];
  dVar5 = bin->m_t[1];
  dVar7 = ain->m_t[0];
  if ((((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) || (dVar5 != -1.23432101234321e+308)) ||
     (NAN(dVar5))) {
    dVar2 = ain->m_t[1];
    if (((dVar7 != -1.23432101234321e+308) || (NAN(dVar7))) ||
       ((dVar2 != -1.23432101234321e+308 || (NAN(dVar2))))) {
      dVar8 = dVar7;
      if ((dVar2 < dVar7) && (dVar8 = dVar2, dVar7 < dVar2)) {
        dVar8 = ON_DBL_QNAN;
      }
      dVar9 = dVar1;
      if ((dVar5 < dVar1) && (dVar9 = dVar5, dVar1 < dVar5)) {
        dVar9 = ON_DBL_QNAN;
      }
      dVar8 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar9 |
                      (ulong)dVar8 & -(ulong)(dVar8 <= dVar9));
      dVar7 = (double)(~-(ulong)(!NAN(dVar7) && !NAN(dVar2)) & (ulong)ON_DBL_QNAN |
                      (~-(ulong)(dVar2 <= dVar7) & (ulong)dVar2 |
                      -(ulong)(dVar2 <= dVar7) & (ulong)dVar7) &
                      -(ulong)(!NAN(dVar7) && !NAN(dVar2)));
      dVar1 = (double)(~-(ulong)(!NAN(dVar1) && !NAN(dVar5)) & (ulong)ON_DBL_QNAN |
                      (~-(ulong)(dVar5 <= dVar1) & (ulong)dVar5 |
                      -(ulong)(dVar5 <= dVar1) & (ulong)dVar1) &
                      -(ulong)(!NAN(dVar1) && !NAN(dVar5)));
      uVar4 = -(ulong)(dVar1 <= dVar7);
      dVar7 = (double)(~uVar4 & (ulong)dVar1 | uVar4 & (ulong)dVar7);
      if (dVar7 < dVar8) {
        this->m_t[0] = EmptyInterval.m_t[0];
        this->m_t[1] = dVar6;
        bVar3 = 0;
        goto LAB_0057e74f;
      }
      this->m_t[0] = dVar8;
    }
    else {
      if (dVar1 <= dVar5) {
        dVar6 = dVar1;
        dVar7 = dVar1;
        if (dVar1 < dVar5) {
          dVar7 = dVar5;
        }
      }
      else {
        dVar6 = (double)(~-(ulong)(dVar1 < dVar5) & (ulong)dVar5 |
                        -(ulong)(dVar1 < dVar5) & (ulong)ON_DBL_QNAN);
        dVar7 = ON_DBL_QNAN;
        if (!NAN(dVar1) && !NAN(dVar5)) {
          dVar7 = (double)(~-(ulong)(dVar5 <= dVar1) & (ulong)dVar5 |
                          (ulong)dVar1 & -(ulong)(dVar5 <= dVar1));
        }
      }
      this->m_t[0] = dVar6;
    }
    this->m_t[1] = dVar7;
    bVar3 = 1;
  }
  else {
    dVar1 = ain->m_t[1];
    if (dVar7 <= dVar1) {
      dVar5 = dVar7;
      dVar6 = dVar7;
      if (dVar7 < dVar1) {
        dVar5 = dVar1;
      }
    }
    else {
      dVar6 = (double)(~-(ulong)(dVar7 < dVar1) & (ulong)dVar1 |
                      -(ulong)(dVar7 < dVar1) & (ulong)ON_DBL_QNAN);
      dVar5 = ON_DBL_QNAN;
      if (!NAN(dVar7) && !NAN(dVar1)) {
        dVar5 = (double)(~-(ulong)(dVar1 <= dVar7) & (ulong)dVar1 |
                        (ulong)dVar7 & -(ulong)(dVar1 <= dVar7));
      }
    }
    this->m_t[0] = dVar6;
    this->m_t[1] = dVar5;
    bVar3 = -(dVar6 != -1.23432101234321e+308) | -(dVar5 != -1.23432101234321e+308);
  }
LAB_0057e74f:
  return (bool)(bVar3 & 1);
}

Assistant:

bool
ON_Interval::IsEmptyInterval() const
{
  return ( m_t[0] == ON_UNSET_VALUE && m_t[1] == ON_UNSET_VALUE ) ? true : false;
}